

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O3

UChar * u_strtok_r_63(UChar *src,UChar *delim,UChar **saveState)

{
  uint uVar1;
  UChar *pUVar2;
  UChar *string;
  
  if (src == (UChar *)0x0) {
    src = *saveState;
    if (src == (UChar *)0x0) {
      return (UChar *)0x0;
    }
  }
  else {
    *saveState = src;
  }
  pUVar2 = (UChar *)0x0;
  uVar1 = _matchFromSet(src,delim,'\0');
  uVar1 = (int)uVar1 >> 0x1f ^ uVar1;
  if (src[uVar1] == L'\0') {
    string = (UChar *)0x0;
  }
  else {
    string = src + uVar1;
    uVar1 = _matchFromSet(string,delim,'\x01');
    if ((int)uVar1 < 0) {
      pUVar2 = (UChar *)0x0;
    }
    else {
      pUVar2 = string + uVar1 + 1;
      string[uVar1] = L'\0';
    }
  }
  *saveState = pUVar2;
  return string;
}

Assistant:

U_CAPI UChar* U_EXPORT2
u_strtok_r(UChar    *src, 
     const UChar    *delim,
           UChar   **saveState)
{
    UChar *tokSource;
    UChar *nextToken;
    uint32_t nonDelimIdx;

    /* If saveState is NULL, the user messed up. */
    if (src != NULL) {
        tokSource = src;
        *saveState = src; /* Set to "src" in case there are no delimiters */
    }
    else if (*saveState) {
        tokSource = *saveState;
    }
    else {
        /* src == NULL && *saveState == NULL */
        /* This shouldn't happen. We already finished tokenizing. */
        return NULL;
    }

    /* Skip initial delimiters */
    nonDelimIdx = u_strspn(tokSource, delim);
    tokSource = &tokSource[nonDelimIdx];

    if (*tokSource) {
        nextToken = u_strpbrk(tokSource, delim);
        if (nextToken != NULL) {
            /* Create a token */
            *(nextToken++) = 0;
            *saveState = nextToken;
            return tokSource;
        }
        else if (*saveState) {
            /* Return the last token */
            *saveState = NULL;
            return tokSource;
        }
    }
    else {
        /* No tokens were found. Only delimiters were left. */
        *saveState = NULL;
    }
    return NULL;
}